

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFileParser::ParseString(cmListFileParser *this,char *str,char *virtual_filename)

{
  bool bVar1;
  int iVar2;
  string local_38;
  
  this->FileName = virtual_filename;
  iVar2 = cmListFileLexer_SetString(this->Lexer,str);
  if (iVar2 != 0) {
    bVar1 = Parse(this);
    return bVar1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"cmListFileCache: cannot allocate buffer.","");
  cmMessenger::IssueMessage(this->Messenger,FATAL_ERROR,&local_38,&this->Backtrace);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmListFileParser::ParseString(const char* str,
                                   const char* virtual_filename)
{
  this->FileName = virtual_filename;

  if (!cmListFileLexer_SetString(this->Lexer, str)) {
    this->IssueFileOpenError("cmListFileCache: cannot allocate buffer.");
    return false;
  }

  return this->Parse();
}